

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy-stubs-internal.h
# Opt level: O2

char * duckdb_snappy::Varint::Encode32(char *sptr,uint32_t v)

{
  byte bVar1;
  uint8_t *ptr;
  
  bVar1 = (byte)v;
  if (v < 0x80) {
    *sptr = bVar1;
    return sptr + 1;
  }
  if (v < 0x4000) {
    *sptr = bVar1 | 0x80;
    sptr[1] = (char)(v >> 7);
    return sptr + 2;
  }
  if (v < 0x200000) {
    *sptr = bVar1 | 0x80;
    sptr[1] = (byte)(v >> 7) | 0x80;
    sptr[2] = (char)(v >> 0xe);
    return sptr + 3;
  }
  *sptr = bVar1 | 0x80;
  sptr[1] = (byte)(v >> 7) | 0x80;
  sptr[2] = (byte)(v >> 0xe) | 0x80;
  bVar1 = (byte)(v >> 0x15);
  if (v < 0x10000000) {
    sptr[3] = bVar1;
    return sptr + 4;
  }
  sptr[3] = bVar1 | 0x80;
  sptr[4] = (byte)(v >> 0x1c);
  return sptr + 5;
}

Assistant:

inline char* Varint::Encode32(char* sptr, uint32_t v) {
  // Operate on characters as unsigneds
  uint8_t* ptr = reinterpret_cast<uint8_t*>(sptr);
  static const uint8_t B = 128;
  if (v < (1 << 7)) {
    *(ptr++) = static_cast<uint8_t>(v);
  } else if (v < (1 << 14)) {
    *(ptr++) = static_cast<uint8_t>(v | B);
    *(ptr++) = static_cast<uint8_t>(v >> 7);
  } else if (v < (1 << 21)) {
    *(ptr++) = static_cast<uint8_t>(v | B);
    *(ptr++) = static_cast<uint8_t>((v >> 7) | B);
    *(ptr++) = static_cast<uint8_t>(v >> 14);
  } else if (v < (1 << 28)) {
    *(ptr++) = static_cast<uint8_t>(v | B);
    *(ptr++) = static_cast<uint8_t>((v >> 7) | B);
    *(ptr++) = static_cast<uint8_t>((v >> 14) | B);
    *(ptr++) = static_cast<uint8_t>(v >> 21);
  } else {
    *(ptr++) = static_cast<uint8_t>(v | B);
    *(ptr++) = static_cast<uint8_t>((v>>7) | B);
    *(ptr++) = static_cast<uint8_t>((v>>14) | B);
    *(ptr++) = static_cast<uint8_t>((v>>21) | B);
    *(ptr++) = static_cast<uint8_t>(v >> 28);
  }
  return reinterpret_cast<char*>(ptr);
}